

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O1

size_t __thiscall chatra::Tuple::find(Tuple *this,StringTable *sTable,StringId key)

{
  ulong uVar1;
  pointer pbVar2;
  pointer pcVar3;
  const_iterator cVar4;
  ulong uVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  key_type local_40;
  
  uVar5 = (ulong)key;
  uVar1 = (this->sidToIndex)._M_h._M_bucket_count;
  uVar6 = uVar5 % uVar1;
  p_Var7 = (this->sidToIndex)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var7->_M_nxt, p_Var8 = p_Var7, *(StringId *)&p_Var7->_M_nxt[1]._M_nxt != key)) {
    while (p_Var7 = p_Var9, p_Var9 = p_Var7->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)*(StringId *)&p_Var9[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, *(StringId *)&p_Var9[1]._M_nxt == key)) goto LAB_001b2111;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_001b2111:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var8->_M_nxt;
  }
  if (p_Var9 == (_Hash_node_base *)0x0) {
    pbVar2 = (sTable->idToStr).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = pbVar2[uVar5]._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar3,pcVar3 + pbVar2[uVar5]._M_string_length);
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->strToIndex)._M_h,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      return (size_t)(_Hash_node_base *)0xffffffffffffffff;
    }
    p_Var9 = (_Hash_node_base *)
             ((long)cVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur + 0x28);
  }
  else {
    p_Var9 = p_Var9 + 2;
  }
  return (size_t)p_Var9->_M_nxt;
}

Assistant:

size_t Tuple::find(const StringTable* sTable, StringId key) const {
	auto it0 = sidToIndex.find(key);
	if (it0 != sidToIndex.end())
		return it0->second;

	auto it1 = strToIndex.find(sTable->ref(key));
	if (it1 != strToIndex.end())
		return it1->second;

	return SIZE_MAX;
}